

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,optional<bool> *value)

{
  bool bVar1;
  optional<bool> local_24;
  bool local_22 [2];
  bool v;
  optional<bool> *poStack_20;
  optional<bool> *value_local;
  AsciiParser *this_local;
  
  poStack_20 = value;
  value_local = (optional<bool> *)this;
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<bool>::operator=(poStack_20);
    this_local._7_1_ = true;
  }
  else {
    bVar1 = ReadBasicType(this,local_22);
    if (bVar1) {
      nonstd::optional_lite::optional<bool>::optional<bool_&,_0>(&local_24,local_22);
      nonstd::optional_lite::optional<bool>::operator=(poStack_20,&local_24);
      nonstd::optional_lite::optional<bool>::~optional(&local_24);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<bool> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  bool v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}